

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O0

MessageLite * google::protobuf::internal::Launder<google::protobuf::MessageLite>(MessageLite *p)

{
  MessageLite *pMVar1;
  MessageLite *p_local;
  
  pMVar1 = std::launder<google::protobuf::MessageLite>(p);
  return pMVar1;
}

Assistant:

constexpr T* Launder(T* p) {
#if defined(__cpp_lib_launder) && __cpp_lib_launder >= 201606L
  return std::launder(p);
#elif ABSL_HAVE_BUILTIN(__builtin_launder)
  return __builtin_launder(p);
#else
  return p;
#endif
}